

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O2

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,WitnessVersion witness_ver,TaprootScriptTree *tree,
          SchnorrPubkey *internal_pubkey,string *bech32_hrp)

{
  _Rb_tree_header *p_Var1;
  NetType_conflict NVar2;
  CfdSourceLocation local_48;
  
  NVar2 = kCfdConnectionError;
  if (bech32_hrp->_M_string_length == 0) {
    NVar2 = type;
  }
  this->type_ = NVar2;
  this->addr_type_ = kTaprootAddress;
  this->witness_ver_ = witness_ver;
  ::std::__cxx11::string::string((string *)&this->address_,"",(allocator *)&local_48);
  ByteData::ByteData(&this->hash_);
  Pubkey::Pubkey(&this->pubkey_);
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_,tree);
  Script::Script(&this->redeem_script_);
  p_Var1 = &(this->format_data_).map_._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->format_data_).map_._M_t._M_impl = 0;
  *(undefined8 *)&(this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->checksum_[0] = '\0';
  this->checksum_[1] = '\0';
  this->checksum_[2] = '\0';
  this->checksum_[3] = '\0';
  TapBranch::GetTweakedPubkey
            ((SchnorrPubkey *)&local_48,&tree->super_TapBranch,internal_pubkey,(bool *)0x0);
  ByteData256::operator=(&(this->schnorr_pubkey_).data_,(ByteData256 *)&local_48);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
  CalculateTaproot(this,bech32_hrp);
  local_48.filename = "cfdcore_address.cpp";
  local_48.line = 0x303;
  local_48.funcname = "Address";
  logger::info<cfd::core::NetType&,cfd::core::AddressType&,std::__cxx11::string_const&>
            (&local_48,"call Address({},{},{})",&this->type_,&this->addr_type_,bech32_hrp);
  return;
}

Assistant:

Address::Address(
    NetType type, WitnessVersion witness_ver, const TaprootScriptTree& tree,
    const SchnorrPubkey& internal_pubkey, const std::string& bech32_hrp)
    : type_((!bech32_hrp.empty()) ? kCustomChain : type),
      addr_type_(AddressType::kTaprootAddress),
      witness_ver_(witness_ver),
      address_(""),
      hash_(),
      pubkey_(),
      schnorr_pubkey_(),
      script_tree_(tree),
      redeem_script_() {
  memset(checksum_, 0, sizeof(checksum_));
  schnorr_pubkey_ = tree.GetTweakedPubkey(internal_pubkey);
  CalculateTaproot(bech32_hrp);
  info(
      CFD_LOG_SOURCE, "call Address({},{},{})", type_, addr_type_, bech32_hrp);
}